

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::AsyncifyAssertInNonInstrumented::~AsyncifyAssertInNonInstrumented
          (AsyncifyAssertInNonInstrumented *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AsyncifyBuilder *pAVar2;
  pointer pcVar3;
  
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__AsyncifyAssertInNonInstrumented_00d72c60;
  pAVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
           ._M_t.
           super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
           .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
           _M_head_impl;
  if (pAVar2 != (AsyncifyBuilder *)0x0) {
    operator_delete(pAVar2,0x28);
  }
  (this->builder)._M_t.
  super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
  ._M_t.
  super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
  .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>._M_head_impl =
       (AsyncifyBuilder *)0x0;
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Pass_00d722d8;
  pcVar3 = (this->super_Pass).name._M_dataplus._M_p;
  paVar1 = &(this->super_Pass).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }